

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O1

bool Cipher::mutateClusters(TParameters *params,TClusters *clusters)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  int iVar5;
  
  piVar2 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  piVar3 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  iVar4 = rand();
  iVar4 = iVar4 % (int)((ulong)((long)piVar2 - (long)piVar3) >> 2);
  iVar1 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[iVar4];
  do {
    iVar5 = rand();
    iVar5 = iVar5 % (params->maxClusters + -1) + 1;
    (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[iVar4] = iVar5;
  } while (iVar5 == iVar1);
  return true;
}

Assistant:

bool mutateClusters(const TParameters & params, TClusters & clusters) {
        int n = clusters.size();

        for (int i = 0; i < 1; ++i) {
            int idx = rand()%n;

            auto old = clusters[idx];
            do {
                clusters[idx] = 1 + rand()%(params.maxClusters - 1);
            } while (clusters[idx] == old);
        }

        return true;
    }